

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

void * bfy_buffer_make_contiguous(bfy_buffer *buf,size_t wanted)

{
  bfy_pos begin;
  bfy_pos begin_00;
  bfy_pos end;
  bfy_pos end_00;
  int8_t *data_00;
  undefined1 local_c8 [8];
  bfy_page newpage;
  undefined8 local_88;
  size_t local_80;
  size_t n_moved;
  int8_t *data;
  size_t local_60;
  size_t local_58;
  size_t local_50;
  size_t n_copied;
  bfy_iovec space;
  bfy_pos pos;
  size_t wanted_local;
  bfy_buffer *buf_local;
  
  buffer_get_pos((bfy_pos *)&space.iov_len,buf,wanted);
  if ((space.iov_len == 0) || ((space.iov_len == 1 && (pos.page_idx == 0)))) {
    buf_local = (bfy_buffer *)buffer_read_begin(buf);
  }
  else {
    bfy_buffer_mute_change_events(buf);
    _n_copied = bfy_buffer_peek_space(buf);
    if (space.iov_base < pos.page_pos) {
      data_00 = (int8_t *)(*allocator.malloc)(pos.page_pos);
      buffer_get_pos((bfy_pos *)&newpage.unref_arg,buf,0);
      begin_00.page_pos = local_88;
      begin_00.page_idx = (size_t)newpage.unref_arg;
      begin_00.content_pos = local_80;
      end_00.page_pos = pos.page_idx;
      end_00.page_idx = space.iov_len;
      end_00.content_pos = pos.page_pos;
      newpage.data = (int8_t *)buffer_remove(buf,begin_00,end_00,data_00);
      newpage.size = 0;
      newpage.write_pos._0_4_ = 0;
      newpage.flags = 0;
      newpage._36_4_ = 0;
      newpage.unref_cb = (bfy_unref_cb *)0x0;
      local_c8 = (undefined1  [8])data_00;
      newpage.read_pos = (size_t)newpage.data;
      buffer_prepend_pages(buf,(bfy_page *)local_c8,1);
    }
    else {
      buffer_get_pos((bfy_pos *)&data,buf,0);
      begin.page_pos = local_60;
      begin.page_idx = (size_t)data;
      begin.content_pos = local_58;
      end.page_pos = pos.page_idx;
      end.page_idx = space.iov_len;
      end.content_pos = pos.page_pos;
      local_50 = buffer_copyout(buf,begin,end,(void *)n_copied);
      bfy_buffer_commit_space(buf,local_50);
      bfy_buffer_drain(buf,local_50);
    }
    bfy_buffer_unmute_change_events(buf);
    buf_local = (bfy_buffer *)buffer_read_begin(buf);
  }
  return buf_local;
}

Assistant:

void*
bfy_buffer_make_contiguous(bfy_buffer* buf, size_t wanted) {
    struct bfy_pos const pos = buffer_get_pos(buf, wanted);

    // if the first page already holds wanted, then we're done
    if ((pos.page_idx == 0) || (pos.page_idx == 1 && pos.page_pos == 0)) {
        return buffer_read_begin(buf);
    }

    bfy_buffer_mute_change_events(buf);

    // if we have enough space, use it
    struct bfy_iovec space = bfy_buffer_peek_space(buf);
    if (space.iov_len >= pos.content_pos) {
        size_t const n_copied = buffer_copyout(buf, buffer_get_pos(buf, 0), pos, space.iov_base);
        bfy_buffer_commit_space(buf, n_copied);
        bfy_buffer_drain(buf, n_copied);
    } else {
        // make some new free space, use it, and prepend it
        int8_t* data = allocator.malloc(pos.content_pos);
        size_t const n_moved = buffer_remove(buf, buffer_get_pos(buf, 0), pos, data);
        struct bfy_page const newpage = {
            .data = data,
            .size = n_moved,
            .write_pos = n_moved
        };
        buffer_prepend_pages(buf, &newpage, 1);
    }

    bfy_buffer_unmute_change_events(buf);
    return buffer_read_begin(buf);
}